

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1507.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  time_t tVar8;
  long lVar9;
  int still_running;
  int maxfd;
  long curl_timeo;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  ulong local_1d8;
  timeval local_1d0;
  time_t local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e8 = 1;
  curl_global_init(3);
  lVar4 = curl_easy_init();
  iVar3 = 0;
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                  ,0x4b);
    iVar3 = 0x7c;
  }
  if (lVar4 == 0) {
    lVar5 = 0;
    uVar6 = 0;
  }
  else {
    lVar5 = curl_multi_init();
    iVar3 = 0;
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                    ,0x4d);
      iVar3 = 0x7b;
    }
    if (lVar5 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = curl_slist_append(0,"<1507-recipient@example.com>");
      curl_easy_setopt(lVar4,0x2712,URL);
      curl_easy_setopt(lVar4,0x2e,1);
      curl_easy_setopt(lVar4,0x4e2c,read_callback);
      curl_easy_setopt(lVar4,0x27ca,"<1507-realuser@example.com>");
      curl_easy_setopt(lVar4,0x27cb,uVar6);
      curl_easy_setopt(lVar4,0x29,1);
      iVar2 = curl_multi_add_handle(lVar5,lVar4);
      uVar1 = _stderr;
      iVar3 = 0;
      if (iVar2 != 0) {
        uVar7 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1507.c"
                      ,0x5e,iVar2,uVar7);
        iVar3 = iVar2;
      }
      if (iVar3 == 0) {
        iVar3 = 0;
        local_1c0 = time((time_t *)0x0);
        curl_multi_perform(lVar5,&local_1e8);
        if (local_1e8 != 0) {
          local_1e0 = uVar6;
          do {
            local_1e4 = -1;
            local_1d8 = 0xffffffffffffffff;
            local_b8.fds_bits[0] = 0;
            local_b8.fds_bits[1] = 0;
            local_b8.fds_bits[2] = 0;
            local_b8.fds_bits[3] = 0;
            local_b8.fds_bits[4] = 0;
            local_b8.fds_bits[5] = 0;
            local_b8.fds_bits[6] = 0;
            local_b8.fds_bits[7] = 0;
            local_b8.fds_bits[8] = 0;
            local_b8.fds_bits[9] = 0;
            local_b8.fds_bits[10] = 0;
            local_b8.fds_bits[0xb] = 0;
            local_b8.fds_bits[0xc] = 0;
            local_b8.fds_bits[0xd] = 0;
            local_b8.fds_bits[0xe] = 0;
            local_b8.fds_bits[0xf] = 0;
            local_138.fds_bits[0] = 0;
            local_138.fds_bits[1] = 0;
            local_138.fds_bits[2] = 0;
            local_138.fds_bits[3] = 0;
            local_138.fds_bits[4] = 0;
            local_138.fds_bits[5] = 0;
            local_138.fds_bits[6] = 0;
            local_138.fds_bits[7] = 0;
            local_138.fds_bits[8] = 0;
            local_138.fds_bits[9] = 0;
            local_138.fds_bits[10] = 0;
            local_138.fds_bits[0xb] = 0;
            local_138.fds_bits[0xc] = 0;
            local_138.fds_bits[0xd] = 0;
            local_138.fds_bits[0xe] = 0;
            local_138.fds_bits[0xf] = 0;
            local_1b8.fds_bits[0xe] = 0;
            local_1b8.fds_bits[0xf] = 0;
            local_1b8.fds_bits[0xc] = 0;
            local_1b8.fds_bits[0xd] = 0;
            local_1b8.fds_bits[10] = 0;
            local_1b8.fds_bits[0xb] = 0;
            local_1b8.fds_bits[8] = 0;
            local_1b8.fds_bits[9] = 0;
            local_1b8.fds_bits[6] = 0;
            local_1b8.fds_bits[7] = 0;
            local_1b8.fds_bits[4] = 0;
            local_1b8.fds_bits[5] = 0;
            local_1b8.fds_bits[2] = 0;
            local_1b8.fds_bits[3] = 0;
            local_1b8.fds_bits[0] = 0;
            local_1b8.fds_bits[1] = 0;
            local_1d0.tv_sec = 1;
            local_1d0.tv_usec = 0;
            curl_multi_timeout(lVar5,&local_1d8);
            if (-1 < (long)local_1d8) {
              local_1d0.tv_sec = local_1d8 / 1000;
              if (local_1d8 < 2000) {
                local_1d0.tv_usec = (local_1d8 % 1000) * 1000;
              }
              else {
                local_1d0.tv_sec = 1;
              }
            }
            curl_multi_fdset(lVar5,&local_b8,&local_138,&local_1b8,&local_1e4);
            iVar3 = select(local_1e4 + 1,&local_b8,&local_138,&local_1b8,&local_1d0);
            tVar8 = time((time_t *)0x0);
            lVar9 = tVar8 - local_1c0;
            if (lVar9 < 0x3d) {
              if (iVar3 != -1) {
                curl_multi_perform(lVar5,&local_1e8);
              }
            }
            else {
              curl_mfprintf(_stderr,
                            "ABORTING TEST, since it seems that it would have run forever.\n");
            }
            iVar3 = 0;
            uVar6 = local_1e0;
          } while ((lVar9 < 0x3d) && (local_1e8 != 0));
        }
      }
    }
  }
  curl_slist_free_all(uVar6);
  curl_multi_remove_handle(lVar5,lVar4);
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
   int res = 0;
   CURL *curl = NULL;
   CURLM *mcurl = NULL;
   int still_running = 1;
   struct timeval mp_start;
   struct curl_slist *rcpt_list = NULL;

   curl_global_init(CURL_GLOBAL_DEFAULT);

   easy_init(curl);

   multi_init(mcurl);

   rcpt_list = curl_slist_append(rcpt_list, RECIPIENT);
   /* more addresses can be added here
      rcpt_list = curl_slist_append(rcpt_list, "<others@example.com>");
   */

   curl_easy_setopt(curl, CURLOPT_URL, URL);
#if 0
   curl_easy_setopt(curl, CURLOPT_USERNAME, USERNAME);
   curl_easy_setopt(curl, CURLOPT_PASSWORD, PASSWORD);
#endif
   curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
   curl_easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
   curl_easy_setopt(curl, CURLOPT_MAIL_FROM, MAILFROM);
   curl_easy_setopt(curl, CURLOPT_MAIL_RCPT, rcpt_list);
   curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
   multi_add_handle(mcurl, curl);

   mp_start = tvnow();

  /* we start some action by calling perform right away */
  curl_multi_perform(mcurl, &still_running);

  while(still_running) {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(mcurl, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(mcurl, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    if(tvdiff(tvnow(), mp_start) > MULTI_PERFORM_HANG_TIMEOUT) {
      fprintf(stderr, "ABORTING TEST, since it seems "
              "that it would have run forever.\n");
      break;
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(mcurl, &still_running);
      break;
    }
  }

test_cleanup:

  curl_slist_free_all(rcpt_list);
  curl_multi_remove_handle(mcurl, curl);
  curl_multi_cleanup(mcurl);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}